

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O0

void __thiscall
QSslConfiguration::setMissingCertificateIsFatal(QSslConfiguration *this,bool cannotRecover)

{
  byte bVar1;
  QSslConfigurationPrivate *pQVar2;
  byte in_SIL;
  undefined6 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  pQVar2 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                     ((QSharedDataPointer<QSslConfigurationPrivate> *)
                      (CONCAT17(in_SIL,CONCAT16(in_SIL,in_stack_fffffffffffffff0)) &
                      0x101ffffffffffff));
  pQVar2->missingCertIsFatal = (bool)(bVar1 & 1);
  return;
}

Assistant:

void QSslConfiguration::setMissingCertificateIsFatal(bool cannotRecover)
{
#if QT_CONFIG(openssl)
    d->missingCertIsFatal = cannotRecover;
#else
    Q_UNUSED(cannotRecover);
    qCWarning(lcSsl, "Handling a missing certificate as a fatal error requires an OpenSSL backend");
#endif // openssl
}